

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_diff_values.h
# Opt level: O2

string * __thiscall
cute::diff_values<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
          (string *__return_storage_ptr__,cute *this,_CM_RETURN_STATUS *expected,
          _CM_RETURN_STATUS *actual,char *left,char *right)

{
  string sStack_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cute_to_string::to_string<_CM_RETURN_STATUS>(&sStack_a8,(_CM_RETURN_STATUS *)this);
  cute_to_string::backslashQuoteTabNewline(&local_88,&sStack_a8);
  std::operator+(&local_68,":\t",&local_88);
  std::operator+(&local_48,&local_68,'\t');
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cute_to_string::to_string<_CM_RETURN_STATUS>(&sStack_a8,expected);
  cute_to_string::backslashQuoteTabNewline(&local_88,&sStack_a8);
  std::operator+(&local_68,":\t",&local_88);
  std::operator+(&local_48,&local_68,'\t');
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string diff_values(ExpectedValue const &expected
						, ActualValue const & actual
						, char const *left="expected"
						, char const *right="but was"){
		// construct a simple message...to be parsed by IDE support
		std::string res;
		res += ' ';
		res += left;
		res+=":\t" + cute_to_string::backslashQuoteTabNewline(cute_to_string::to_string(expected))+'\t';
		res += right;
		res +=":\t"+cute_to_string::backslashQuoteTabNewline(cute_to_string::to_string(actual))+'\t';
		return res;
	}